

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*),std::tuple<int,int>>
::IteratorImpl<testing::internal::IndexSequence<0ul,1ul>>::AdvanceIfEnd<1ul>
          (IteratorImpl<testing::internal::IndexSequence<0ul,1ul>> *this)

{
  bool bVar1;
  
  bVar1 = ParamIterator<std::tuple<int,_int>_>::operator!=
                    ((ParamIterator<std::tuple<int,_int>_> *)(this + 0x30),
                     (ParamIterator<std::tuple<int,_int>_> *)(this + 0x20));
  if (bVar1) {
    return;
  }
  ParamIterator<std::tuple<int,_int>_>::operator=
            ((ParamIterator<std::tuple<int,_int>_> *)(this + 0x30),
             (ParamIterator<std::tuple<int,_int>_> *)(this + 0x10));
  (**(code **)(**(long **)(this + 0x38) + 0x18))();
  AdvanceIfEnd<0ul>(this);
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }